

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O1

size_t __thiscall dg::DGLLVMPointsToSet::size(DGLLVMPointsToSet *this)

{
  bool bVar1;
  size_t sVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  _Hash_node_base *p_Var5;
  
  sVar2 = 0;
  for (p_Var3 = (((this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
                 PTSet)->pointers)._bits.
                super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
                .
                super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    p_Var5 = p_Var3[2]._M_nxt;
    lVar4 = 0;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      do {
        lVar4 = lVar4 + (ulong)((uint)p_Var5 & 1);
        bVar1 = (_Hash_node_base *)0x1 < p_Var5;
        p_Var5 = (_Hash_node_base *)((ulong)p_Var5 >> 1);
      } while (bVar1);
    }
    sVar2 = sVar2 + lVar4;
  }
  return sVar2;
}

Assistant:

size_t size() const override { return PTSet.size(); }